

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operands.c
# Opt level: O3

void EffAdr(OpConfig *EA,int Bad)

{
  int iVar1;
  
  iVar1 = EA->Mode;
  if (((uint)Bad >> (iVar1 - 1U & 0x1f) & 1) != 0) {
    Error(EA->Loc,5);
    return;
  }
  if (0xc < iVar1) {
    return;
  }
  if (iVar1 < 8) {
    Op = (iVar1 - 1U) * 8 | EA->Rn | Op;
  }
  else {
    Op = iVar1 - 8U | Op | 0x38;
  }
  OperExt(EA);
  return;
}

Assistant:

void 
EffAdr (register struct OpConfig *EA, int Bad)
/* Adds effective address field to Op (BITSET representing opcode). */
{
	if ((1 << (EA->Mode - 1)) IN Bad) {
		Error(EA->Loc, ModeErr); /* Invalid mode */
		return;
	} else if (EA->Mode > 12) /* Special modes */
		return;
	else if (EA->Mode < 8) /* Register direct or indirect */
		Op |= ((EA->Mode - 1) << 3) | EA->Rn;
	else
		Op |= 0x0038 | (EA->Mode - 8); /* Absolute modes */
	OperExt(EA);
}